

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

string * __thiscall
libcellml::Importer::ImporterImpl::modelUrl_abi_cxx11_
          (string *__return_storage_ptr__,ImporterImpl *this,ModelPtr *model)

{
  element_type *peVar1;
  _Rb_tree_node_base *p_Var2;
  undefined1 *puVar3;
  
  p_Var2 = (this->mLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  peVar1 = (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  puVar3 = libcellml::ORIGIN_MODEL_REF_abi_cxx11_;
  do {
    if ((_Rb_tree_header *)p_Var2 == &(this->mLibrary)._M_t._M_impl.super__Rb_tree_header) {
LAB_001eca3f:
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)puVar3);
      return __return_storage_ptr__;
    }
    if (*(element_type **)(p_Var2 + 2) == peVar1) {
      puVar3 = (undefined1 *)(p_Var2 + 1);
      goto LAB_001eca3f;
    }
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

std::string Importer::ImporterImpl::modelUrl(const ModelPtr &model) const
{
    for (const auto &entry : mLibrary) {
        if (entry.second == model) {
            return entry.first;
        }
    }

    return ORIGIN_MODEL_REF;
}